

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O3

void cft_fasttext_predictions_free(fasttext_predictions_t *predictions)

{
  long lVar1;
  ulong uVar2;
  
  if (predictions != (fasttext_predictions_t *)0x0) {
    if (predictions->length != 0) {
      lVar1 = 8;
      uVar2 = 0;
      do {
        free(*(void **)((long)&predictions->predictions->prob + lVar1));
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x10;
      } while (uVar2 < predictions->length);
    }
    free(predictions->predictions);
    free(predictions);
    return;
  }
  return;
}

Assistant:

void cft_fasttext_predictions_free(fasttext_predictions_t* predictions) {
    if (predictions == nullptr) {
        return;
    }
    for (size_t i = 0; i < predictions->length; i++) {
        fasttext_prediction_t pred = predictions->predictions[i];
        free(pred.label);
    }
    free(predictions->predictions);
    free(predictions);
}